

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool IsOne(expr_node *node)

{
  expr_node *node_local;
  bool local_1;
  
  if (node == (expr_node *)0x0) {
    local_1 = false;
  }
  else if ((node->type == '\x01') && ((node->value).integer == 1)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsOne(const expr_node* node)
{
    if (node == nullptr)
        return false;
    if (node->type == INT && node->value.integer == 1)
        return true;
    else
        return false;
}